

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O1

void __thiscall ipx::ForrestTomlin::SolvePermuted(ForrestTomlin *this,Vector *lhs,char trans)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  double *pdVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer piVar9;
  bool bVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  double dVar14;
  
  piVar5 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = (uint)((ulong)((long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar5) >> 2);
  if ((trans & 0xdfU) == 0x54) {
    if (0 < (int)uVar13) {
      pdVar6 = lhs->_M_data;
      iVar2 = this->dim_;
      uVar11 = 0;
      do {
        iVar3 = piVar5[uVar11];
        pdVar6[(long)iVar2 + uVar11] = pdVar6[iVar3];
        pdVar6[iVar3] = 0.0;
        uVar11 = uVar11 + 1;
      } while ((uVar13 & 0x7fffffff) != uVar11);
    }
    TriangularSolve(&this->U_,lhs,'t',"upper",0);
    if (0 < (int)uVar13) {
      iVar2 = this->dim_;
      pdVar6 = lhs->_M_data;
      piVar5 = (this->R_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->R_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->R_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = (ulong)(uVar13 & 0x7fffffff);
      do {
        iVar3 = piVar5[uVar11 - 1];
        lVar12 = (long)iVar3;
        iVar4 = piVar5[uVar11];
        if (iVar3 < iVar4) {
          dVar14 = pdVar6[(long)iVar2 + (uVar11 - 1)];
          do {
            iVar3 = piVar7[lVar12];
            pdVar6[iVar3] = pdVar8[lVar12] * -dVar14 + pdVar6[iVar3];
            lVar12 = lVar12 + 1;
          } while (iVar4 != lVar12);
        }
        uVar1 = uVar11 - 1;
        pdVar6[piVar9[uVar1]] = pdVar6[(long)iVar2 + uVar1];
        pdVar6[(long)iVar2 + uVar1] = 0.0;
        bVar10 = 1 < (long)uVar11;
        uVar11 = uVar1;
      } while (bVar10);
    }
    TriangularSolve(&this->L_,lhs,'t',"lower",1);
    return;
  }
  TriangularSolve(&this->L_,lhs,'n',"lower",1);
  if (0 < (int)uVar13) {
    piVar5 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = lhs->_M_data;
    piVar7 = (this->R_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->R_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->R_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = this->dim_;
    uVar11 = 0;
    do {
      iVar3 = piVar7[uVar11];
      lVar12 = (long)iVar3;
      iVar4 = piVar7[uVar11 + 1];
      dVar14 = 0.0;
      if (iVar3 < iVar4) {
        do {
          dVar14 = dVar14 + pdVar6[piVar9[lVar12]] * pdVar8[lVar12];
          lVar12 = lVar12 + 1;
        } while (iVar4 != lVar12);
      }
      iVar3 = piVar5[uVar11];
      pdVar6[(long)iVar2 + uVar11] = pdVar6[iVar3] - dVar14;
      pdVar6[iVar3] = 0.0;
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uVar13 & 0x7fffffff));
  }
  TriangularSolve(&this->U_,lhs,'n',"upper",0);
  if (0 < (int)uVar13) {
    iVar2 = this->dim_;
    pdVar6 = lhs->_M_data;
    piVar5 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (ulong)(uVar13 & 0x7fffffff) + 1;
    do {
      pdVar6[piVar5[lVar12 + -2]] = pdVar6[(long)iVar2 + lVar12 + -2];
      pdVar6[(long)iVar2 + lVar12 + -2] = 0.0;
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
  return;
}

Assistant:

void ForrestTomlin::SolvePermuted(Vector& lhs, char trans) {
    Int num_updates = replaced_.size();
    assert(U_.cols() == dim_+num_updates);

    // Require num_updates elements workspace at end of lhs.
    assert((Int)lhs.size() >= dim_+num_updates);

    if (trans == 't' || trans == 'T') {
        // Move replaced entries to the end of the pivot sequence and zero out
        // their old position. Because the corresponding columns of U are unit
        // columns now, the replaced positions remain zero when solving with U'.
        // This is crucial because we neglected to zero out the corresponding
        // rows of U in the update, so there are entries in U which actually
        // should not be there.
        for (Int k = 0; k < num_updates; k++) {
            lhs[dim_+k] = lhs[replaced_[k]];
            lhs[replaced_[k]] = 0.0;
        }
        TriangularSolve(U_, lhs, 't', "upper", 0);
        // Solve backwards with row eta matrices (leading scatter operations)
        // and put the entry from the end of the pivot sequence back into the
        // position that its update replaced.
        for (Int k = num_updates-1; k >= 0; k--) {
            ScatterColumn(R_, k, -lhs[dim_+k], lhs);
            lhs[replaced_[k]] = lhs[dim_+k];
            lhs[dim_+k] = 0.0;
        }
        TriangularSolve(L_, lhs, 't', "lower", 1);
    }
    else {
        TriangularSolve(L_, lhs, 'n', "lower", 1);
        // Solve forward with row eta matrices (leading gather operations) and
        // put the newly computed entry at the end of the pivot sequence. We
        // actually would not need to zero out the replaced positions here
        // because they will not be accessed by any subsequent eta matrix.
        for (Int k = 0; k < num_updates; k++) {
            lhs[dim_+k] = lhs[replaced_[k]] - DotColumn(R_, k, lhs);
            lhs[replaced_[k]] = 0.0;
        }
        // The triangular solve with U fills the replaced position with garbage.
        // This does not hurt because by the fact that the corresponding columns
        // of U have no nonzero off-diagonal entries, the computed values are
        // not propagated further. We finally overwrite them with their actual
        // values from the end of the pivot sequence.
        TriangularSolve(U_, lhs, 'n', "upper", 0);
        for (Int k = num_updates-1; k >= 0; k--) {
            lhs[replaced_[k]] = lhs[dim_+k];
            lhs[dim_+k] = 0.0;
        }
    }
}